

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O0

Seg_Man_t * Seg_ManAlloc(Gia_Man_t *pGia,int nFanouts)

{
  int iVar1;
  Seg_Man_t *p_00;
  Vec_Int_t *pVVar2;
  sat_solver *psVar3;
  Seg_Man_t *p;
  int nVarsAll;
  int nFanouts_local;
  Gia_Man_t *pGia_local;
  
  p_00 = (Seg_Man_t *)calloc(1,0x78);
  pVVar2 = Vec_IntAlloc(1000);
  p_00->vPolars = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  p_00->vToSkip = pVVar2;
  pVVar2 = Seg_ManCountIntEdges(pGia,p_00->vPolars,p_00->vToSkip,nFanouts);
  p_00->vEdges = pVVar2;
  iVar1 = Vec_IntSize(p_00->vEdges);
  p_00->nVars = iVar1 / 2;
  iVar1 = Abc_Base2Log(p_00->nVars);
  p_00->LogN = iVar1;
  p_00->Power2 = 1 << ((byte)p_00->LogN & 0x1f);
  psVar3 = sat_solver_new();
  p_00->pSat = psVar3;
  sat_solver_setnvars(p_00->pSat,p_00->nVars);
  iVar1 = sat_solver_nvars(p_00->pSat);
  p_00->FirstVar = iVar1;
  sat_solver_bookmark(p_00->pSat);
  p_00->pGia = pGia;
  pVVar2 = Vec_IntAlloc(0);
  p_00->vFirsts = pVVar2;
  pVVar2 = Vec_IntAlloc(0);
  p_00->vNvars = pVVar2;
  pVVar2 = Vec_IntAlloc(0);
  p_00->vLits = pVVar2;
  iVar1 = Seg_ManCountIntLevels(p_00,p_00->FirstVar);
  sat_solver_setnvars(p_00->pSat,iVar1);
  Gia_ManFillValue(pGia);
  return p_00;
}

Assistant:

Seg_Man_t * Seg_ManAlloc( Gia_Man_t * pGia, int nFanouts )
{
    int nVarsAll;
    Seg_Man_t * p = ABC_CALLOC( Seg_Man_t, 1 );
    p->vPolars    = Vec_IntAlloc( 1000 ); 
    p->vToSkip    = Vec_IntAlloc( 1000 ); 
    p->vEdges     = Seg_ManCountIntEdges( pGia, p->vPolars, p->vToSkip, nFanouts );
    p->nVars      = Vec_IntSize(p->vEdges)/2;
    p->LogN       = Abc_Base2Log(p->nVars);
    p->Power2     = 1 << p->LogN;
    //p->pSat       = Sbm_AddCardinSolver( p->LogN, &p->vCardVars );
    p->pSat       = sat_solver_new();
    sat_solver_setnvars( p->pSat, p->nVars );
    p->FirstVar   = sat_solver_nvars( p->pSat );
    sat_solver_bookmark( p->pSat );
    p->pGia       = pGia;
    // internal
    p->vFirsts    = Vec_IntAlloc( 0 ); 
    p->vNvars     = Vec_IntAlloc( 0 ); 
    p->vLits      = Vec_IntAlloc( 0 ); 
    nVarsAll      = Seg_ManCountIntLevels( p, p->FirstVar );
    sat_solver_setnvars( p->pSat, nVarsAll );
    // other
    Gia_ManFillValue( pGia );
    return p;
}